

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O3

uint64_t art_allocate_index(art_t *art,art_typecode_t typecode)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  uint64_t uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = CONCAT71(in_register_00000031,typecode) & 0xffffffff;
  uVar2 = art->first_free[uVar8];
  iVar4 = (int)CONCAT71(in_register_00000031,typecode);
  if (uVar2 == art->capacities[uVar8]) {
    if (uVar2 == 0) {
      uVar9 = 2;
    }
    else if (uVar2 < 0x400) {
      uVar9 = uVar2 * 2;
    }
    else {
      uVar9 = uVar2 * 5 >> 2;
    }
    uVar7 = (ulong)(uint)(iVar4 * 8);
    *(ulong *)((long)art->capacities + uVar7) = uVar9;
    lVar3 = *(long *)((long)ART_NODE_SIZES + uVar7);
    pvVar5 = roaring_realloc(*(void **)((long)art->nodes + uVar7),lVar3 * uVar9);
    *(void **)((long)art->nodes + uVar7) = pvVar5;
    memset((void *)((uVar2 & 0xffffffffffff) * lVar3 + (long)pvVar5),0,(uVar9 - uVar2) * lVar3);
    if (uVar2 < uVar9) {
      uVar7 = uVar2;
      do {
        uVar1 = uVar7 + 1;
        if ((byte)(typecode - 1) < 5) {
          *(ulong *)((long)art->nodes[uVar8] + (uVar7 & 0xffffffffffff) * lVar3) = uVar1;
        }
        uVar7 = uVar1;
      } while (uVar9 != uVar1);
    }
    uVar6 = art->first_free[uVar8] + 1;
  }
  else if ((byte)(typecode - 1) < 5) {
    uVar9 = (ulong)(uint)(iVar4 * 8);
    uVar6 = *(uint64_t *)
             (*(long *)((long)art->nodes + uVar9) +
             (uVar2 & 0xffffffffffff) * *(long *)((long)ART_NODE_SIZES + uVar9));
  }
  else {
    uVar6 = 0;
  }
  art->first_free[uVar8] = uVar6;
  return uVar2;
}

Assistant:

static uint64_t art_allocate_index(art_t *art, art_typecode_t typecode) {
    uint64_t first_free = art->first_free[typecode];
    if (first_free == art->capacities[typecode]) {
        art_extend(art, typecode);
        art->first_free[typecode]++;
        return first_free;
    }
    art->first_free[typecode] = art_next_free(art, typecode);
    return first_free;
}